

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

int run_test_fs_readdir_empty_dir(void)

{
  void *pvVar1;
  char *__s1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar3;
  uv_fs_t *puVar4;
  uv_fs_t *puVar5;
  long lVar6;
  uv_fs_t rmdir_req;
  uv_fs_t mkdir_req;
  undefined1 auStack_c88 [440];
  uv_fs_t *puStack_ad0;
  undefined1 auStack_ac0 [440];
  uv_fs_t uStack_908;
  undefined1 auStack_750 [440];
  undefined1 auStack_598 [440];
  uv_fs_t *puStack_3e0;
  undefined1 local_380 [440];
  undefined1 local_1c8 [440];
  
  uVar3 = uv_default_loop();
  uv_fs_mkdir(uVar3,local_1c8,"./empty_dir/",0x1ff,0);
  uv_fs_req_cleanup(local_1c8);
  memset(&opendir_req,0xdb,0x1b8);
  puVar4 = (uv_fs_t *)uv_default_loop();
  iVar2 = uv_fs_opendir(puVar4,&opendir_req,"./empty_dir/",0);
  pvVar1 = opendir_req.ptr;
  if (iVar2 == 0) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a5ee;
    if (opendir_req.result != 0) goto LAB_0015a5f3;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015a5f8;
    uv_fs_req_cleanup(&opendir_req);
    memset(&readdir_req,0xdb,0x1b8);
    *(uv_dirent_t **)pvVar1 = dirents;
    *(undefined8 *)((long)pvVar1 + 8) = 1;
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_readdir(puVar4,&readdir_req,pvVar1,0);
    if (iVar2 != 0) goto LAB_0015a5fd;
    uv_fs_req_cleanup(&readdir_req);
    memset(&closedir_req,0xdb,0x1b8);
    puVar4 = (uv_fs_t *)uv_default_loop();
    uv_fs_closedir(puVar4,&closedir_req,pvVar1,0);
    if (closedir_req.result != 0) goto LAB_0015a602;
    uv_fs_req_cleanup(&closedir_req);
    memset(&opendir_req,0xdb,0x1b8);
    memset(&readdir_req,0xdb,0x1b8);
    memset(&closedir_req,0xdb,0x1b8);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_opendir(puVar4,&opendir_req,"./empty_dir/",empty_opendir_cb);
    if (iVar2 != 0) goto LAB_0015a607;
    if (empty_opendir_cb_count != 0) goto LAB_0015a60c;
    if (empty_closedir_cb_count != 0) goto LAB_0015a611;
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_run(puVar4,0);
    if (iVar2 != 0) goto LAB_0015a616;
    if (empty_opendir_cb_count != 1) goto LAB_0015a61b;
    if (empty_closedir_cb_count != 1) goto LAB_0015a620;
    uVar3 = uv_default_loop();
    uv_fs_rmdir(uVar3,local_380,"./empty_dir/",0);
    uv_fs_req_cleanup(local_380);
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_empty_dir_cold_1();
LAB_0015a5ee:
    run_test_fs_readdir_empty_dir_cold_2();
LAB_0015a5f3:
    run_test_fs_readdir_empty_dir_cold_3();
LAB_0015a5f8:
    run_test_fs_readdir_empty_dir_cold_13();
LAB_0015a5fd:
    run_test_fs_readdir_empty_dir_cold_4();
LAB_0015a602:
    run_test_fs_readdir_empty_dir_cold_5();
LAB_0015a607:
    run_test_fs_readdir_empty_dir_cold_6();
LAB_0015a60c:
    run_test_fs_readdir_empty_dir_cold_7();
LAB_0015a611:
    run_test_fs_readdir_empty_dir_cold_8();
LAB_0015a616:
    run_test_fs_readdir_empty_dir_cold_9();
LAB_0015a61b:
    run_test_fs_readdir_empty_dir_cold_10();
LAB_0015a620:
    run_test_fs_readdir_empty_dir_cold_11();
  }
  run_test_fs_readdir_empty_dir_cold_12();
  pvVar1 = opendir_req.ptr;
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a6a3;
    if (opendir_req.result != 0) goto LAB_0015a6a8;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015a6ad;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)pvVar1 + 8) = 1;
    uVar3 = uv_default_loop();
    iVar2 = uv_fs_readdir(uVar3,&readdir_req,pvVar1,empty_readdir_cb);
    if (iVar2 == 0) {
      iVar2 = uv_fs_req_cleanup(&opendir_req);
      empty_opendir_cb_count = empty_opendir_cb_count + 1;
      return iVar2;
    }
  }
  else {
    empty_opendir_cb_cold_1();
LAB_0015a6a3:
    empty_opendir_cb_cold_2();
LAB_0015a6a8:
    empty_opendir_cb_cold_3();
LAB_0015a6ad:
    empty_opendir_cb_cold_5();
  }
  empty_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar4 = (uv_fs_t *)uv_default_loop();
  iVar2 = uv_fs_opendir(puVar4,&opendir_req,"./non-existing-dir/",0);
  if (iVar2 == -2) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a7c1;
    if (opendir_req.result != -2) goto LAB_0015a7c6;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0015a7cb;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_opendir(puVar4,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    if (iVar2 != 0) goto LAB_0015a7d0;
    if (non_existing_opendir_cb_count != 0) goto LAB_0015a7d5;
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_run(puVar4,0);
    if (iVar2 != 0) goto LAB_0015a7da;
    if (non_existing_opendir_cb_count != 1) goto LAB_0015a7df;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_0015a7c1:
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_0015a7c6:
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_0015a7cb:
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_0015a7d0:
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_0015a7d5:
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_0015a7da:
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_0015a7df:
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a82c;
    if (opendir_req.result != -2) goto LAB_0015a831;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    non_existing_opendir_cb_cold_1();
LAB_0015a82c:
    non_existing_opendir_cb_cold_2();
LAB_0015a831:
    non_existing_opendir_cb_cold_3();
  }
  non_existing_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar4 = (uv_fs_t *)uv_default_loop();
  iVar2 = uv_fs_opendir(puVar4,&opendir_req,"test/fixtures/empty_file",0);
  if (iVar2 == -0x14) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a945;
    if (opendir_req.result != -0x14) goto LAB_0015a94a;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0015a94f;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_opendir(puVar4,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    if (iVar2 != 0) goto LAB_0015a954;
    if (file_opendir_cb_count != 0) goto LAB_0015a959;
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_run(puVar4,0);
    if (iVar2 != 0) goto LAB_0015a95e;
    if (file_opendir_cb_count != 1) goto LAB_0015a963;
    puVar5 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar5,close_walk_cb,0);
    uv_run(puVar5,0);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0015a945:
    run_test_fs_readdir_file_cold_2();
LAB_0015a94a:
    run_test_fs_readdir_file_cold_3();
LAB_0015a94f:
    run_test_fs_readdir_file_cold_4();
LAB_0015a954:
    run_test_fs_readdir_file_cold_5();
LAB_0015a959:
    run_test_fs_readdir_file_cold_6();
LAB_0015a95e:
    run_test_fs_readdir_file_cold_7();
LAB_0015a963:
    puVar5 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  run_test_fs_readdir_file_cold_9();
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a9b0;
    if (opendir_req.result != -0x14) goto LAB_0015a9b5;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0015a9b0:
    file_opendir_cb_cold_2();
LAB_0015a9b5:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_ad0 = (uv_fs_t *)0x15a9d5;
  puStack_3e0 = puVar5;
  cleanup_test_files();
  puStack_ad0 = (uv_fs_t *)0x15a9da;
  uVar3 = uv_default_loop();
  puStack_ad0 = (uv_fs_t *)0x15a9f9;
  iVar2 = uv_fs_mkdir(uVar3,auStack_750,"test_dir",0x1ed,0);
  if (iVar2 == 0) {
    puStack_ad0 = (uv_fs_t *)0x15aa06;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15aa2b;
    iVar2 = uv_fs_open(uVar3,&uStack_908,"test_dir/file1",0x41,0x180,0);
    puVar4 = puVar5;
    if (iVar2 < 0) goto LAB_0015add1;
    puVar4 = &uStack_908;
    puStack_ad0 = (uv_fs_t *)0x15aa43;
    uv_fs_req_cleanup(puVar4);
    puStack_ad0 = (uv_fs_t *)0x15aa48;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15aa5a;
    iVar2 = uv_fs_close(uVar3,auStack_ac0,(undefined4)uStack_908.result,0);
    if (iVar2 != 0) goto LAB_0015add6;
    puStack_ad0 = (uv_fs_t *)0x15aa6c;
    uv_fs_req_cleanup(auStack_ac0);
    puStack_ad0 = (uv_fs_t *)0x15aa71;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15aa96;
    iVar2 = uv_fs_open(uVar3,&uStack_908,"test_dir/file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_0015addb;
    puVar4 = &uStack_908;
    puStack_ad0 = (uv_fs_t *)0x15aaae;
    uv_fs_req_cleanup(puVar4);
    puStack_ad0 = (uv_fs_t *)0x15aab3;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15aac5;
    iVar2 = uv_fs_close(uVar3,auStack_ac0,(undefined4)uStack_908.result,0);
    if (iVar2 != 0) goto LAB_0015ade0;
    puStack_ad0 = (uv_fs_t *)0x15aad7;
    uv_fs_req_cleanup(auStack_ac0);
    puStack_ad0 = (uv_fs_t *)0x15aadc;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15aafb;
    iVar2 = uv_fs_mkdir(uVar3,auStack_750,"test_dir/test_subdir",0x1ed,0);
    if (iVar2 != 0) goto LAB_0015ade5;
    puStack_ad0 = (uv_fs_t *)0x15ab10;
    uv_fs_req_cleanup(auStack_750);
    puVar4 = &opendir_req;
    puStack_ad0 = (uv_fs_t *)0x15ab29;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_ad0 = (uv_fs_t *)0x15ab2e;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ab42;
    iVar2 = uv_fs_opendir(uVar3,&opendir_req,"test_dir",0);
    puVar5 = (uv_fs_t *)opendir_req.ptr;
    if (iVar2 != 0) goto LAB_0015adea;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015adef;
    if (opendir_req.result != 0) goto LAB_0015adf4;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015adf9;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar5 + 8) = 1;
    puStack_ad0 = (uv_fs_t *)0x15ab93;
    uv_fs_req_cleanup(&opendir_req);
    puStack_ad0 = (uv_fs_t *)0x15ab98;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15abac;
    iVar2 = uv_fs_readdir(uVar3,&readdir_req,puVar5,0);
    if (iVar2 == 0) {
LAB_0015adc7:
      puStack_ad0 = (uv_fs_t *)0x15adcc;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_0015adcc;
    }
    lVar6 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_ad0 = (uv_fs_t *)0x15abe1;
      iVar2 = strcmp(dirents[0].name,"file1");
      if (iVar2 != 0) {
        puStack_ad0 = (uv_fs_t *)0x15abf4;
        iVar2 = strcmp(__s1,"file2");
        if (iVar2 == 0) goto LAB_0015ac0b;
        puStack_ad0 = (uv_fs_t *)0x15ac03;
        iVar2 = strcmp(__s1,"test_subdir");
        if (iVar2 == 0) goto LAB_0015ac0b;
LAB_0015adbd:
        puStack_ad0 = (uv_fs_t *)0x15adc2;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015adc2:
        puStack_ad0 = (uv_fs_t *)0x15adc7;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015adc7;
      }
LAB_0015ac0b:
      puStack_ad0 = (uv_fs_t *)0x15ac16;
      iVar2 = strcmp(__s1,"test_subdir");
      if (iVar2 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015ac33;
        goto LAB_0015adc2;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_ad0 = (uv_fs_t *)0x15adbd;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_0015adbd;
      }
LAB_0015ac33:
      puStack_ad0 = (uv_fs_t *)0x15ac3b;
      uv_fs_req_cleanup(&readdir_req);
      puStack_ad0 = (uv_fs_t *)0x15ac40;
      uVar3 = uv_default_loop();
      puStack_ad0 = (uv_fs_t *)0x15ac50;
      iVar2 = uv_fs_readdir(uVar3,&readdir_req,puVar5,0);
      lVar6 = lVar6 + -1;
    } while (iVar2 != 0);
    if (lVar6 != 0) goto LAB_0015adc7;
    puStack_ad0 = (uv_fs_t *)0x15ac70;
    uv_fs_req_cleanup(&readdir_req);
    puStack_ad0 = (uv_fs_t *)0x15ac89;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_ad0 = (uv_fs_t *)0x15ac8e;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ac9e;
    uv_fs_closedir(uVar3,&closedir_req,puVar5,0);
    if (closedir_req.result != 0) goto LAB_0015adfe;
    puStack_ad0 = (uv_fs_t *)0x15acb8;
    uv_fs_req_cleanup(&closedir_req);
    puVar5 = &opendir_req;
    puStack_ad0 = (uv_fs_t *)0x15acd1;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_ad0 = (uv_fs_t *)0x15acd6;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15acef;
    iVar2 = uv_fs_opendir(uVar3,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar2 != 0) goto LAB_0015ae03;
    if (non_empty_opendir_cb_count != 0) goto LAB_0015ae08;
    if (non_empty_closedir_cb_count != 0) goto LAB_0015ae0d;
    puStack_ad0 = (uv_fs_t *)0x15ad16;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ad20;
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0015ae12;
    if (non_empty_opendir_cb_count != 1) goto LAB_0015ae17;
    if (non_empty_closedir_cb_count == 1) {
      puStack_ad0 = (uv_fs_t *)0x15ad47;
      uVar3 = uv_default_loop();
      puStack_ad0 = (uv_fs_t *)0x15ad63;
      uv_fs_rmdir(uVar3,auStack_598,"test_subdir",0);
      puStack_ad0 = (uv_fs_t *)0x15ad6b;
      uv_fs_req_cleanup(auStack_598);
      puStack_ad0 = (uv_fs_t *)0x15ad70;
      cleanup_test_files();
      puStack_ad0 = (uv_fs_t *)0x15ad75;
      puVar5 = (uv_fs_t *)uv_default_loop();
      puStack_ad0 = (uv_fs_t *)0x15ad89;
      uv_walk(puVar5,close_walk_cb,0);
      puStack_ad0 = (uv_fs_t *)0x15ad93;
      uv_run(puVar5,0);
      puStack_ad0 = (uv_fs_t *)0x15ad98;
      uVar3 = uv_default_loop();
      puStack_ad0 = (uv_fs_t *)0x15ada0;
      iVar2 = uv_loop_close(uVar3);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0015ae21;
    }
  }
  else {
LAB_0015adcc:
    puStack_ad0 = (uv_fs_t *)0x15add1;
    run_test_fs_readdir_non_empty_dir_cold_1();
    puVar4 = puVar5;
LAB_0015add1:
    puStack_ad0 = (uv_fs_t *)0x15add6;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0015add6:
    puStack_ad0 = (uv_fs_t *)0x15addb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0015addb:
    puStack_ad0 = (uv_fs_t *)0x15ade0;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0015ade0:
    puStack_ad0 = (uv_fs_t *)0x15ade5;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0015ade5:
    puStack_ad0 = (uv_fs_t *)0x15adea;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0015adea:
    puStack_ad0 = (uv_fs_t *)0x15adef;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0015adef:
    puStack_ad0 = (uv_fs_t *)0x15adf4;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0015adf4:
    puVar5 = puVar4;
    puStack_ad0 = (uv_fs_t *)0x15adf9;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0015adf9:
    puStack_ad0 = (uv_fs_t *)0x15adfe;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0015adfe:
    puStack_ad0 = (uv_fs_t *)0x15ae03;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0015ae03:
    puStack_ad0 = (uv_fs_t *)0x15ae08;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0015ae08:
    puStack_ad0 = (uv_fs_t *)0x15ae0d;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0015ae0d:
    puStack_ad0 = (uv_fs_t *)0x15ae12;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0015ae12:
    puStack_ad0 = (uv_fs_t *)0x15ae17;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0015ae17:
    puStack_ad0 = (uv_fs_t *)0x15ae1c;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_ad0 = (uv_fs_t *)0x15ae21;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_0015ae21:
  puStack_ad0 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_ad0 = puVar5;
  uv_fs_unlink(0,auStack_c88,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_c88);
  uv_fs_unlink(0,auStack_c88,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_c88);
  uv_fs_rmdir(0,auStack_c88,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_c88);
  uv_fs_rmdir(0,auStack_c88,"test_dir",0);
  iVar2 = uv_fs_req_cleanup(auStack_c88);
  return iVar2;
}

Assistant:

TEST_IMPL(fs_readdir_empty_dir) {
  const char* path;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  int r;
  int nb_entries_read;
  uv_dir_t* dir;

  path = "./empty_dir/";
  uv_fs_mkdir(uv_default_loop(), &mkdir_req, path, 0777, NULL);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    NULL);
  ASSERT(r == 0);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == 0);
  ASSERT(opendir_req.ptr != NULL);
  dir = opendir_req.ptr;
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&readdir_req, 0xdb, sizeof(readdir_req));
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  nb_entries_read = uv_fs_readdir(uv_default_loop(),
                                  &readdir_req,
                                  dir,
                                  NULL);
  ASSERT(nb_entries_read == 0);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT(closedir_req.result == 0);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));
  memset(&readdir_req, 0xdb, sizeof(readdir_req));
  memset(&closedir_req, 0xdb, sizeof(closedir_req));

  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, empty_opendir_cb);
  ASSERT(r == 0);
  ASSERT(empty_opendir_cb_count == 0);
  ASSERT(empty_closedir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(empty_opendir_cb_count == 1);
  ASSERT(empty_closedir_cb_count == 1);
  uv_fs_rmdir(uv_default_loop(), &rmdir_req, path, NULL);
  uv_fs_req_cleanup(&rmdir_req);
  MAKE_VALGRIND_HAPPY();
  return 0;
}